

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_mem.cpp
# Opt level: O2

void * operator_new__(size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  if (size != 0) {
    pvVar1 = malloc(size);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = srand;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* operator new[](size_t size) noexcept(false)
{
  if (size < 1)
    throw std::bad_alloc();
  /* malloc */
  void *ptr = eco_malloc(size);
  if (!ptr)
    throw std::bad_alloc();
  return ptr;
}